

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O2

vector<chromosome_inf,_std::allocator<chromosome_inf>_> *
get_reference_inf(vector<chromosome_inf,_std::allocator<chromosome_inf>_> *__return_storage_ptr__,
                 string *reference)

{
  undefined8 uVar1;
  char cVar2;
  char *pcVar3;
  char local_6b8 [8];
  char buffer [1024];
  ifstream ref_index_handle;
  byte abStack_298 [488];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  chromosome_inf tmpinf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  allocator<char> local_31;
  
  (__return_storage_ptr__->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(local_6b8,0,0x400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,".fai",(allocator<char> *)&tmpinf.line_bases);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 reference,&local_b0);
  std::ifstream::ifstream(buffer + 0x3f8,(string *)local_90,_S_in);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    while (pcVar3 = local_6b8, (abStack_298[*(long *)(buffer._1016_8_ + -0x18)] & 2) == 0) {
      local_90 = (undefined1  [8])&tmpinf.chromosome._M_string_length;
      tmpinf.chromosome._M_dataplus._M_p = (pointer)0x0;
      tmpinf.chromosome._M_string_length._0_1_ = 0;
      std::istream::getline(buffer + 0x3f8,(long)pcVar3);
      if (local_6b8[0] != '\0') {
        tmpinf.line_bases = 0;
        tmpinf.line_width = 0;
        while( true ) {
          pcVar3 = strtok(pcVar3,"\t");
          if (pcVar3 == (char *)0x0) break;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar3,&local_31);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &tmpinf.line_bases,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          pcVar3 = (char *)0x0;
        }
        std::__cxx11::string::string((string *)&local_b0,(string *)tmpinf._48_8_);
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        tmpinf.chromosome.field_2._8_8_ = strtoull(*(char **)(tmpinf._48_8_ + 0x20),(char **)0x0,10)
        ;
        tmpinf.len = strtoull(*(char **)(tmpinf._48_8_ + 0x40),(char **)0x0,10);
        uVar1 = tmpinf._48_8_;
        tmpinf.start_offset._0_4_ = atoi(*(char **)(tmpinf._48_8_ + 0x60));
        tmpinf.start_offset._4_4_ = atoi(*(char **)(uVar1 + 0x80));
        std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tmpinf.line_bases);
      }
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(buffer + 0x3f8);
  return __return_storage_ptr__;
}

Assistant:

vector<chromosome_inf> get_reference_inf(string reference){
    //2021-6-16 13:02:45
    vector<struct chromosome_inf> ref_inf;
    char buffer[1024]{0};
    // cout << reference+ string(".fai")<<endl;

    ifstream ref_index_handle (reference + string(".fai")); 
    if (ref_index_handle.is_open()){
        while (! ref_index_handle.eof() )
        {
            struct chromosome_inf tmpinf;

            ref_index_handle.getline (buffer,1024);  //读入每行
            if ( strlen(buffer) == 0 ){
                continue;
            }
            
            // C type string split 
            vector<string> res;
            char* temp = strtok(buffer, "\t");
            while(temp != NULL)
            {
                res.push_back(string(temp));
                temp = strtok(NULL, "\t");
            }

            tmpinf.chromosome = string(res[0]);
            tmpinf.len = strtoull( res[1].c_str(), NULL,10 );
            tmpinf.start_offset = strtoull( res[2].c_str(), NULL,10 );
            tmpinf.line_bases = atoi( res[3].c_str() );
            tmpinf.line_width = atoi( res[4].c_str() );

            ref_inf.push_back(tmpinf);

            // cout<< tmpinf.chromosome <<endl;
            // cout<< tmpinf.len <<endl;
            // cout<< tmpinf.start_offset <<endl;
            // cout<< tmpinf.line_bases <<endl;
            // cout<< tmpinf.line_width <<endl;
            
        }
    }
    
    ref_index_handle.close();


    return ref_inf;
}